

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

intptr_t ArrayFindEx(array *p,size_t Count,size_t Width,void *Data,arraycmp Cmp,void *CmpParam,
                    bool_t *Found)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  char *__s1;
  ulong uVar4;
  bool_t bVar5;
  
  if (p == (array *)0x0) {
    __assert_fail("&(*p)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                  ,0x1be,
                  "intptr_t ArrayFindEx(const array *, size_t, size_t, const void *, arraycmp, const void *, bool_t *)"
                 );
  }
  uVar2 = p->_Used;
  if (uVar2 == 0) {
    *Found = 0;
    uVar2 = 0;
  }
  else {
    if ((Count == 0xffffffffffffffff) && (Count = uVar2 / Width, Count * Width - uVar2 != 0)) {
      __assert_fail("Count*Width == ArraySize(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                    ,0x1c7,
                    "intptr_t ArrayFindEx(const array *, size_t, size_t, const void *, arraycmp, const void *, bool_t *)"
                   );
    }
    if (Cmp == (arraycmp)0x0) {
      __s1 = p->_Begin;
      bVar5 = 1;
      for (uVar2 = 0; Count != uVar2; uVar2 = uVar2 + 1) {
        iVar1 = bcmp(__s1,Data,Width);
        if (iVar1 == 0) goto LAB_0012019d;
        __s1 = __s1 + Width;
      }
      bVar5 = 0;
      uVar2 = Count;
LAB_0012019d:
      *Found = bVar5;
    }
    else {
      lVar3 = Count - 1;
      uVar2 = 0;
      uVar4 = 0;
      while ((long)uVar4 <= lVar3) {
        uVar2 = lVar3 + uVar4 >> 1;
        iVar1 = (*Cmp)(CmpParam,p->_Begin + uVar2 * Width,Data);
        if (iVar1 < 1) {
          if (-1 < iVar1) {
            *Found = 1;
            return uVar2;
          }
          uVar4 = uVar2 + 1;
        }
        else {
          lVar3 = uVar2 - 1;
        }
      }
      *Found = 0;
      if (lVar3 != uVar2 - 1) {
        uVar2 = uVar4;
      }
    }
  }
  return uVar2;
}

Assistant:

intptr_t ArrayFindEx(const array* p, size_t Count, size_t Width, const void* Data, arraycmp Cmp, const void* CmpParam, bool_t* Found)
{
    if (ARRAYEMPTY(*p))
    {
        *Found = 0;
        return 0;
    }

    if (Count == ARRAY_AUTO_COUNT)
    {
        Count = ArraySize(p)/Width;
        assert(Count*Width == ArraySize(p));
    }

    if (Cmp)
    {
        int i;
        intptr_t Mid = 0;
        intptr_t Lower = 0;
        intptr_t Upper = Count-1;

        while (Upper >= Lower)
        {
            Mid = (Upper + Lower) >> 1;

            i = Cmp(CmpParam, ARRAYBEGIN(*p,uint8_t) + Width*Mid, Data);
            if (i>0)
                Upper = Mid-1;
            else if (i<0)
                Lower = Mid+1;
            else
            {
                *Found = 1;
                return Mid;
            }
        }

        *Found = 0;

        if (Upper == Mid - 1)
            return Mid;
        else
            return Lower;
    }
    else
    {
        intptr_t No = 0;
        const char* i;
        for (i=p->_Begin;Count--;i+=Width,++No)
            if (memcmp(i,Data,Width)==0)
            {
                *Found = 1;
                return No;
            }

        *Found = 0;
        return No;
    }
}